

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void fixstr(char *p)

{
  char cVar1;
  
  if (p == (char *)0x0) {
    return;
  }
  do {
    cVar1 = *p;
    if (cVar1 == 'N') {
      cVar1 = '\n';
LAB_00103f29:
      *p = cVar1;
    }
    else {
      if (cVar1 == 'S') {
        cVar1 = ' ';
        goto LAB_00103f29;
      }
      if (cVar1 == 'T') {
        cVar1 = '\t';
        goto LAB_00103f29;
      }
      if (cVar1 == 'Z') {
        cVar1 = '\0';
        goto LAB_00103f29;
      }
      if (cVar1 == '\0') {
        return;
      }
    }
    p = p + 1;
  } while( true );
}

Assistant:

void
fixstr(p)
register char *p;
{
	if (p == NULL)
		return;

	for (; *p != '\0'; p++)
		if (*p == 'N')
			*p = '\n';
		else if (*p == 'T')
			*p = '\t';
		else if (*p == 'S')
			*p = ' ';
		else if (*p == 'Z')
			*p = '\0';
}